

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_certificate_chain.cc
# Opt level: O2

iterator __thiscall
bssl::anon_unknown_12::ValidPolicyGraph::AddNodeReturningIterator
          (ValidPolicyGraph *this,Input policy,
          vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *parent_policies)

{
  _Rb_tree_header *p_Var1;
  size_t *psVar2;
  pointer pmVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  pointer pIVar6;
  bool bVar7;
  bool bVar8;
  _Rb_tree_node_base *this_00;
  _Rb_tree_node_base *p_Var9;
  _Base_ptr *pp_Var10;
  _Rb_tree_node_base *p_Var11;
  _Link_type __p;
  less<bssl::der::Input> *this_01;
  _Rb_tree_node_base *__y;
  Input rhs;
  _Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_> local_88;
  undefined2 local_70;
  uchar *local_60;
  _Base_ptr p_Stack_58;
  _Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_> local_50;
  undefined2 local_38;
  
  rhs.data_.size_ = 4;
  rhs.data_.data_ = "U\x1d ";
  bVar7 = bssl::der::operator!=(policy,rhs);
  if (!bVar7) {
    __assert_fail("policy != der::Input(kAnyPolicyOid)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/verify_certificate_chain.cc"
                  ,0x2d0,
                  "Level::iterator bssl::(anonymous namespace)::ValidPolicyGraph::AddNodeReturningIterator(der::Input, std::vector<der::Input>)"
                 );
  }
  pmVar3 = (this->levels_).
           super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  p_Var4 = (_Base_ptr)
           (parent_policies->super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>
           )._M_impl.super__Vector_impl_data._M_start;
  p_Var5 = (_Base_ptr)
           (parent_policies->super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pIVar6 = (parent_policies->super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>
           )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (parent_policies->super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (parent_policies->super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>)._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (parent_policies->super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70 = 0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38 = 0;
  local_60 = policy.data_.data_;
  p_Stack_58 = (_Base_ptr)policy.data_.size_;
  local_50._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var4;
  local_50._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var5;
  local_50._M_impl.super__Vector_impl_data._M_end_of_storage = pIVar6;
  this_00 = (_Rb_tree_node_base *)operator_new(0x50);
  this_01 = (less<bssl::der::Input> *)(pmVar3 + -1);
  __y = this_00 + 1;
  *(uchar **)(this_00 + 1) = local_60;
  this_00[1]._M_parent = p_Stack_58;
  this_00[1]._M_left = p_Var4;
  this_00[1]._M_right = p_Var5;
  *(pointer *)(this_00 + 2) = pIVar6;
  local_50._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_50._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined2 *)&this_00[2]._M_parent = 0;
  p_Var1 = &pmVar3[-1]._M_t._M_impl.super__Rb_tree_header;
  bVar7 = true;
  pp_Var10 = &pmVar3[-1]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var11 = &p_Var1->_M_header;
  while (p_Var9 = *pp_Var10, p_Var9 != (_Rb_tree_node_base *)0x0) {
    bVar7 = ::std::less<bssl::der::Input>::operator()(this_01,(Input *)__y,(Input *)(p_Var9 + 1));
    p_Var11 = p_Var9;
    pp_Var10 = &p_Var9->_M_left + !bVar7;
  }
  p_Var9 = p_Var11;
  if (bVar7 == false) {
LAB_0038c413:
    __p = (_Link_type)(p_Var9 + 1);
    bVar7 = ::std::less<bssl::der::Input>::operator()(this_01,(Input *)__p,(Input *)__y);
    if (!bVar7) {
      ::std::
      _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>
      ::_M_drop_node((_Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>
                      *)this_00,__p);
      bVar7 = false;
      goto LAB_0038c46d;
    }
  }
  else if (p_Var11 != pmVar3[-1]._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
    p_Var9 = (_Rb_tree_node_base *)::std::_Rb_tree_decrement(p_Var11);
    goto LAB_0038c413;
  }
  bVar7 = true;
  bVar8 = true;
  if (p_Var1 != (_Rb_tree_header *)p_Var11) {
    bVar8 = ::std::less<bssl::der::Input>::operator()(this_01,(Input *)__y,(Input *)(p_Var11 + 1));
  }
  ::std::_Rb_tree_insert_and_rebalance(bVar8,this_00,p_Var11,&p_Var1->_M_header);
  psVar2 = &pmVar3[-1]._M_t._M_impl.super__Rb_tree_header._M_node_count;
  *psVar2 = *psVar2 + 1;
  p_Var9 = this_00;
LAB_0038c46d:
  ::std::_Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>::~_Vector_base(&local_50)
  ;
  ::std::_Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>::~_Vector_base(&local_88)
  ;
  if (bVar7) {
    return (iterator)p_Var9;
  }
  __assert_fail("inserted",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/verify_certificate_chain.cc"
                ,0x2d6,
                "Level::iterator bssl::(anonymous namespace)::ValidPolicyGraph::AddNodeReturningIterator(der::Input, std::vector<der::Input>)"
               );
}

Assistant:

Level::iterator AddNodeReturningIterator(
      der::Input policy, std::vector<der::Input> parent_policies) {
    assert(policy != der::Input(kAnyPolicyOid));
    auto [iter, inserted] = levels_.back().insert(
        std::pair{policy, Node{std::move(parent_policies)}});
    // GCC before 8.1 tracks individual unused bindings and does not support
    // marking them [[maybe_unused]].
    (void)inserted;
    assert(inserted);
    return iter;
  }